

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O0

bool __thiscall
crnlib::find_files::find_internal
          (find_files *this,char *pBasepath,char *pRelpath,char *pFilespec,uint flags,int level)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  DIR *__dirp;
  dirent *pdVar8;
  dynamic_string *pdVar9;
  undefined1 local_c8 [8];
  dynamic_string childpath;
  undefined1 local_b0 [4];
  uint i;
  file_desc *local_a0;
  file_desc *file;
  dynamic_string filename;
  bool is_file;
  bool is_directory;
  dirent *ep;
  dynamic_string_array paths;
  DIR *dp;
  char c;
  undefined1 local_48 [8];
  dynamic_string pathname;
  int level_local;
  uint flags_local;
  char *pFilespec_local;
  char *pRelpath_local;
  char *pBasepath_local;
  find_files *this_local;
  
  pathname.m_pStr._0_4_ = level;
  pathname.m_pStr._4_4_ = flags;
  dynamic_string::dynamic_string((dynamic_string *)local_48);
  sVar6 = strlen(pRelpath);
  if (sVar6 == 0) {
    dynamic_string::operator=((dynamic_string *)local_48,pBasepath);
  }
  else {
    file_utils::combine_path((dynamic_string *)local_48,pBasepath,pRelpath);
  }
  bVar2 = dynamic_string::is_empty((dynamic_string *)local_48);
  if ((!bVar2) && (cVar3 = dynamic_string::back((dynamic_string *)local_48), cVar3 != '/')) {
    dynamic_string::operator+=((dynamic_string *)local_48,"/");
  }
  pcVar7 = dynamic_string::get_ptr((dynamic_string *)local_48);
  __dirp = opendir(pcVar7);
  if (__dirp == (DIR *)0x0) {
    this_local._7_1_ = (int)pathname.m_pStr != 0;
    paths.m_capacity = 1;
  }
  else {
    vector<crnlib::dynamic_string>::vector((vector<crnlib::dynamic_string> *)&ep);
    while (pdVar8 = readdir(__dirp), pdVar8 != (dirent *)0x0) {
      iVar4 = strcmp(pdVar8->d_name,".");
      if ((iVar4 != 0) && (iVar4 = strcmp(pdVar8->d_name,".."), iVar4 != 0)) {
        filename.m_pStr._7_1_ = (byte)((pdVar8->d_type & 4) >> 2);
        filename.m_pStr._6_1_ = (byte)((pdVar8->d_type & 8) >> 3);
        dynamic_string::dynamic_string((dynamic_string *)&file,pdVar8->d_name);
        if (((filename.m_pStr._7_1_ & 1) != 0) && ((pathname.m_pStr._4_4_ & 1) != 0)) {
          vector<crnlib::dynamic_string>::push_back
                    ((vector<crnlib::dynamic_string> *)&ep,(dynamic_string *)&file);
        }
        if ((((filename.m_pStr._6_1_ & 1) != 0) && ((pathname.m_pStr._4_4_ & 4) != 0)) ||
           (((filename.m_pStr._7_1_ & 1) != 0 && ((pathname.m_pStr._4_4_ & 2) != 0)))) {
          pcVar7 = dynamic_string::get_ptr((dynamic_string *)&file);
          iVar4 = fnmatch(pFilespec,pcVar7,0);
          if (iVar4 == 0) {
            uVar5 = vector<crnlib::find_files::file_desc>::size(&this->m_files);
            vector<crnlib::find_files::file_desc>::resize(&this->m_files,uVar5 + 1,false);
            local_a0 = vector<crnlib::find_files::file_desc>::back(&this->m_files);
            local_a0->m_is_dir = (bool)(filename.m_pStr._7_1_ & 1);
            dynamic_string::operator=(&local_a0->m_base,pBasepath);
            dynamic_string::operator=(&local_a0->m_rel,pRelpath);
            dynamic_string::operator=(&local_a0->m_name,(dynamic_string *)&file);
            operator+((crnlib *)local_b0,(dynamic_string *)local_48,(dynamic_string *)&file);
            dynamic_string::operator=(&local_a0->m_fullname,(dynamic_string *)local_b0);
            dynamic_string::~dynamic_string((dynamic_string *)local_b0);
          }
        }
        dynamic_string::~dynamic_string((dynamic_string *)&file);
      }
    }
    closedir(__dirp);
    if ((pathname.m_pStr._4_4_ & 1) != 0) {
      for (childpath.m_pStr._4_4_ = 0; uVar1 = childpath.m_pStr._4_4_,
          uVar5 = vector<crnlib::dynamic_string>::size((vector<crnlib::dynamic_string> *)&ep),
          uVar1 < uVar5; childpath.m_pStr._4_4_ = childpath.m_pStr._4_4_ + 1) {
        dynamic_string::dynamic_string((dynamic_string *)local_c8);
        sVar6 = strlen(pRelpath);
        if (sVar6 == 0) {
          pdVar9 = vector<crnlib::dynamic_string>::operator[]
                             ((vector<crnlib::dynamic_string> *)&ep,childpath.m_pStr._4_4_);
          dynamic_string::operator=((dynamic_string *)local_c8,pdVar9);
        }
        else {
          pdVar9 = vector<crnlib::dynamic_string>::operator[]
                             ((vector<crnlib::dynamic_string> *)&ep,childpath.m_pStr._4_4_);
          pcVar7 = dynamic_string::get_ptr(pdVar9);
          file_utils::combine_path((dynamic_string *)local_c8,pRelpath,pcVar7);
        }
        pcVar7 = dynamic_string::get_ptr((dynamic_string *)local_c8);
        bVar2 = find_internal(this,pBasepath,pcVar7,pFilespec,pathname.m_pStr._4_4_,
                              (int)pathname.m_pStr + 1);
        if (!bVar2) {
          this_local._7_1_ = 0;
        }
        paths.m_capacity = (uint)!bVar2;
        dynamic_string::~dynamic_string((dynamic_string *)local_c8);
        if (paths.m_capacity != 0) goto LAB_00128235;
      }
    }
    this_local._7_1_ = 1;
    paths.m_capacity = 1;
LAB_00128235:
    vector<crnlib::dynamic_string>::~vector((vector<crnlib::dynamic_string> *)&ep);
  }
  dynamic_string::~dynamic_string((dynamic_string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool find_files::find_internal(const char* pBasepath, const char* pRelpath, const char* pFilespec, uint flags, int level)
    {
        dynamic_string pathname;
        if (strlen(pRelpath))
        {
            file_utils::combine_path(pathname, pBasepath, pRelpath);
        }
        else
        {
            pathname = pBasepath;
        }

        if (!pathname.is_empty())
        {
            char c = pathname.back();
            if (c != '/')
            {
                pathname += "/";
            }
        }

        DIR* dp = opendir(pathname.get_ptr());

        if (!dp)
        {
            return level ? true : false;
        }

        dynamic_string_array paths;

        for (;;)
        {
            struct dirent* ep = readdir(dp);
            if (!ep)
            {
                break;
            }
            if ((strcmp(ep->d_name, ".") == 0) || (strcmp(ep->d_name, "..") == 0))
            {
                continue;
            }

            const bool is_directory = (ep->d_type & DT_DIR) != 0;
            const bool is_file = (ep->d_type & DT_REG) != 0;

            dynamic_string filename(ep->d_name);

            if (is_directory)
            {
                if (flags & cFlagRecursive)
                {
                    paths.push_back(filename);
                }
            }

            if (((is_file) && (flags & cFlagAllowFiles)) || ((is_directory) && (flags & cFlagAllowDirs)))
            {
                if (0 == fnmatch(pFilespec, filename.get_ptr(), 0))
                {
                    m_files.resize(m_files.size() + 1);
                    file_desc& file = m_files.back();
                    file.m_is_dir = is_directory;
                    file.m_base = pBasepath;
                    file.m_rel = pRelpath;
                    file.m_name = filename;
                    file.m_fullname = pathname + filename;
                }
            }
        }

        closedir(dp);
        dp = nullptr;

        if (flags & cFlagRecursive)
        {
            for (uint i = 0; i < paths.size(); i++)
            {
                dynamic_string childpath;
                if (strlen(pRelpath))
                {
                    file_utils::combine_path(childpath, pRelpath, paths[i].get_ptr());
                }
                else
                {
                    childpath = paths[i];
                }

                if (!find_internal(pBasepath, childpath.get_ptr(), pFilespec, flags, level + 1))
                {
                    return false;
                }
            }
        }

        return true;
    }